

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O3

void __thiscall
ParsedLPCMTrackData::extractData(ParsedLPCMTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  size_t __n;
  pointer puVar1;
  int iVar2;
  uint8_t *dstData;
  pointer __src;
  
  __n = (this->m_waveBuffer).m_size;
  iVar2 = size + (int)__n;
  pkt->size = iVar2;
  dstData = (uint8_t *)operator_new__((long)iVar2);
  pkt->data = dstData;
  if (__n != 0) {
    puVar1 = (this->m_waveBuffer).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    __src = (pointer)0x0;
    if (puVar1 != (this->m_waveBuffer).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      __src = puVar1;
    }
    memcpy(dstData,__src,__n);
    dstData = dstData + __n;
    (this->m_waveBuffer).m_size = 0;
  }
  if (this->m_convertBytes == true) {
    wave_format::toLittleEndian(dstData,buff,size,(uint)this->m_bitdepth);
    return;
  }
  memcpy(dstData,buff,(long)size);
  return;
}

Assistant:

void ParsedLPCMTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    pkt->size = size + static_cast<int>(m_waveBuffer.size());
    pkt->data = new uint8_t[pkt->size];
    uint8_t* dst = pkt->data;
    if (!m_waveBuffer.isEmpty())
    {
        memcpy(dst, m_waveBuffer.data(), m_waveBuffer.size());
        dst += m_waveBuffer.size();
        m_waveBuffer.clear();
    }
    if (m_convertBytes)
        toLittleEndian(dst, buff, size, m_bitdepth);
    else
        memcpy(dst, buff, size);
}